

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

coop_repository_stats_t * __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
query_coop_repository_stats
          (coop_repository_stats_t *__return_storage_ptr__,
          env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
          *this)

{
  size_type sVar1;
  coop_repository_stats_t stats;
  coop_repository_stats_t local_38;
  
  so_5::impl::coop_repository_basis_t::query_stats
            (&local_38,&(this->m_coop_repo).super_coop_repository_basis_t);
  __return_storage_ptr__->m_registered_coop_count = local_38.m_registered_coop_count;
  __return_storage_ptr__->m_deregistered_coop_count = local_38.m_deregistered_coop_count;
  __return_storage_ptr__->m_total_agent_count = local_38.m_total_agent_count;
  sVar1 = std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::size
                    (&this->m_final_dereg_coops);
  __return_storage_ptr__->m_final_dereg_coop_count = sVar1;
  return __return_storage_ptr__;
}

Assistant:

so_5::environment_infrastructure_t::coop_repository_stats_t
env_infrastructure_t< ACTIVITY_TRACKER >::query_coop_repository_stats()
	{
		const auto stats = m_coop_repo.query_stats();

		return environment_infrastructure_t::coop_repository_stats_t{
				stats.m_registered_coop_count,
				stats.m_deregistered_coop_count,
				stats.m_total_agent_count,
				m_final_dereg_coops.size()
		};
	}